

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::BasicNonMS<tcu::Vector<unsigned_int,_4>,_1>::Run
          (BasicNonMS<tcu::Vector<unsigned_int,_4>,_1> *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  long lVar2;
  GLuint level;
  GLuint texture;
  GLenum *pGVar3;
  GLboolean layered;
  GLuint unit;
  ulong uVar4;
  GLenum GVar5;
  ImageSizeMachine machine;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  bVar1 = ShaderImageSizeBase::SupportedInStage(&this->super_ShaderImageSizeBase,1,8);
  if (bVar1) {
    this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    pGVar3 = &DAT_016e8e40;
    for (uVar4 = 0; uVar4 != 7; uVar4 = uVar4 + 1) {
      GVar5 = *pGVar3;
      glu::CallLogWrapper::glBindTexture(this_00,GVar5,this->m_texture[uVar4]);
      if (uVar4 == 6) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&data,0x100,(allocator_type *)&machine);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
        glu::CallLogWrapper::glBufferData
                  (this_00,0x8c2a,0x100,
                   data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,0x88e4);
        glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8d70,this->m_buffer);
        glu::CallLogWrapper::glBindImageTexture(this_00,7,this->m_texture[6],0,'\0',0,35000,0x8d70);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        goto LAB_00a8e643;
      }
      glu::CallLogWrapper::glTexParameteri(this_00,GVar5,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri(this_00,GVar5,0x2800,0x2600);
      switch((long)&switchD_00a8e4f5::switchdataD_016e8684 +
             (long)(int)(&switchD_00a8e4f5::switchdataD_016e8684)[uVar4 & 0xffffffff]) {
      case 0xa8e4f7:
        glu::CallLogWrapper::glTexStorage2D(this_00,GVar5,10,0x8d70,0x200,0x80);
        texture = this->m_texture[uVar4];
        level = 1;
        unit = level;
        break;
      case 0xa8e525:
        glu::CallLogWrapper::glTexStorage2D(this_00,GVar5,1,0x8d70,0x10,8);
        texture = this->m_texture[uVar4];
        level = 0;
        unit = 5;
        break;
      case 0xa8e555:
        glu::CallLogWrapper::glTexStorage2D(this_00,GVar5,4,0x8d70,0x10,0x10);
        texture = this->m_texture[uVar4];
        unit = 3;
        level = 0;
        layered = '\0';
        GVar5 = 0x88ba;
        goto LAB_00a8e63c;
      case 0xa8e591:
        unit = 4;
        glu::CallLogWrapper::glTexStorage3D(this_00,GVar5,2,0x8d70,4,4,0xc);
        texture = this->m_texture[uVar4];
        level = 1;
        layered = '\x01';
        goto LAB_00a8e62f;
      case 0xa8e5c9:
        glu::CallLogWrapper::glTexStorage3D(this_00,GVar5,3,0x8d70,8,8,4);
        texture = this->m_texture[uVar4];
        unit = 2;
        level = 0;
        goto LAB_00a8e62b;
      case 0xa8e5fa:
        glu::CallLogWrapper::glTexStorage3D(this_00,GVar5,3,0x8d70,0x7f,0x27,0xc);
        texture = this->m_texture[uVar4];
        unit = 6;
        level = 2;
LAB_00a8e62b:
        layered = '\x01';
        goto LAB_00a8e62f;
      }
      layered = '\0';
LAB_00a8e62f:
      GVar5 = 35000;
LAB_00a8e63c:
      glu::CallLogWrapper::glBindImageTexture(this_00,unit,texture,level,layered,0,GVar5,0x8d70);
LAB_00a8e643:
      pGVar3 = pGVar3 + 1;
    }
    ImageSizeMachine::ImageSizeMachine(&machine);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x4000000100;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x800000008;
    lVar2 = gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<unsigned_int,4>>
                      ((ImageSizeMachine *)&machine,1,false,(ivec4 *)&data,false);
    ImageSizeMachine::~ImageSizeMachine(&machine);
  }
  else {
    lVar2 = 0x10;
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 8))
			return NOT_SUPPORTED;

		const GLenum target[7] = { GL_TEXTURE_2D,		 GL_TEXTURE_3D,
								   GL_TEXTURE_CUBE_MAP,  GL_TEXTURE_CUBE_MAP_ARRAY,
								   GL_TEXTURE_RECTANGLE, GL_TEXTURE_2D_ARRAY,
								   GL_TEXTURE_BUFFER };
		for (int i = 0; i < 7; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] != GL_TEXTURE_BUFFER)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexStorage2D(target[i], 10, TexInternalFormat<T>(), 512, 128);
				glBindImageTexture(1, m_texture[i], 1, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 8, 8, 4);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexStorage2D(target[i], 4, TexInternalFormat<T>(), 16, 16);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexStorage3D(target[i], 2, TexInternalFormat<T>(), 4, 4, 12);
				glBindImageTexture(4, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 4)
			{
				glTexStorage2D(target[i], 1, TexInternalFormat<T>(), 16, 8);
				glBindImageTexture(5, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 5)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 127, 39, 12);
				glBindImageTexture(6, m_texture[i], 2, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 6)
			{
				std::vector<GLubyte> data(256);
				glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
				glBufferData(GL_TEXTURE_BUFFER, 256, &data[0], GL_STATIC_DRAW);
				glTexBuffer(GL_TEXTURE_BUFFER, TexInternalFormat<T>(), m_buffer);
				glBindImageTexture(7, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[7] = { ivec4(256, 64, 0, 0), ivec4(8, 8, 4, 0),   ivec4(16, 16, 0, 0), ivec4(2, 2, 2, 0),
						 ivec4(16, 8, 0, 0),   ivec4(31, 9, 12, 0), ivec4(16, 0, 0, 0) };
		return machine.Run<T>(STAGE, false, res);
	}